

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

shared_ptr<notch::core::ActivationLayer> __thiscall
notch::core::MakeLayer::activation(MakeLayer *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  MakeLayer *in_RSI;
  undefined1 *__args_1;
  shared_ptr<notch::core::ActivationLayer> sVar2;
  undefined1 local_41;
  string local_40;
  
  __args_1 = (undefined1 *)in_RSI->maybeActivation;
  if ((Activation *)__args_1 == (Activation *)0x0) {
    __args_1 = linearActivation;
    in_RSI->maybeActivation = (Activation *)linearActivation;
  }
  if (in_RSI->nInputs == 0 && in_RSI->nOutputs != 0) {
    in_RSI->nInputs = in_RSI->nOutputs;
  }
  else if (in_RSI->nInputs == 0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"an ActivationLayer","");
    logic_error(in_RSI,&local_40);
    _Var1._M_pi = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
      _Var1._M_pi = extraout_RDX_01;
    }
    this->nInputs = 0;
    this->nOutputs = 0;
    goto LAB_0017a689;
  }
  this->nInputs = 0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<notch::core::ActivationLayer,std::allocator<notch::core::ActivationLayer>,unsigned_long&,notch::core::Activation_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->nOutputs,(ActivationLayer **)this,
             (allocator<notch::core::ActivationLayer> *)&local_41,&in_RSI->nInputs,
             (Activation *)__args_1);
  _Var1._M_pi = extraout_RDX;
LAB_0017a689:
  sVar2.super___shared_ptr<notch::core::ActivationLayer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<notch::core::ActivationLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<notch::core::ActivationLayer>)
         sVar2.super___shared_ptr<notch::core::ActivationLayer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ActivationLayer> activation() {
        if (!maybeActivation) {
            maybeActivation = &linearActivation;
        }
        if (nOutputs && !nInputs) {
            nInputs = nOutputs;
        }
        if (nInputs) {
            return std::make_shared<ActivationLayer>(nInputs, *maybeActivation);
        } else {
            logic_error("an ActivationLayer");
            return nullptr; // unreachable
        }
    }